

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_sse.c
# Opt level: O0

parasail_profile_t *
parasail_profile_create_stats_sse_128_sat(char *s1,int s1Len,parasail_matrix_t *matrix)

{
  parasail_profile_t *ppVar1;
  parasail_profile_t *__ptr;
  parasail_profile_t *__ptr_00;
  parasail_profile_t *profile32;
  parasail_profile_t *profile16;
  parasail_profile_t *profile8;
  parasail_matrix_t *matrix_local;
  int s1Len_local;
  char *s1_local;
  
  ppVar1 = parasail_profile_create_stats_sse_128_8(s1,s1Len,matrix);
  __ptr = parasail_profile_create_stats_sse_128_16(s1,s1Len,matrix);
  __ptr_00 = parasail_profile_create_stats_sse_128_32(s1,s1Len,matrix);
  (ppVar1->profile16).score = (__ptr->profile16).score;
  (ppVar1->profile16).matches = (__ptr->profile16).matches;
  (ppVar1->profile16).similar = (__ptr->profile16).similar;
  (ppVar1->profile32).score = (__ptr_00->profile32).score;
  (ppVar1->profile32).matches = (__ptr_00->profile32).matches;
  (ppVar1->profile32).similar = (__ptr_00->profile32).similar;
  free(__ptr);
  free(__ptr_00);
  return ppVar1;
}

Assistant:

parasail_profile_t* parasail_profile_create_stats_sse_128_sat(
        const char * const restrict s1, const int s1Len,
        const parasail_matrix_t *matrix)
{
    parasail_profile_t *profile8 = parasail_profile_create_stats_sse_128_8(s1, s1Len, matrix);
    parasail_profile_t *profile16 = parasail_profile_create_stats_sse_128_16(s1, s1Len, matrix);
    parasail_profile_t *profile32 = parasail_profile_create_stats_sse_128_32(s1, s1Len, matrix);
    profile8->profile16 = profile16->profile16;
    profile8->profile32 = profile32->profile32;
    free(profile16);
    free(profile32);

    return profile8;
}